

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2cirs.cpp
# Opt level: O2

void PrintResults(CESkyCoord *input,CESkyCoord *output,double jd)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  CEAngle aCStack_a8 [16];
  double local_98;
  CEDate local_90 [64];
  vector<double,_std::allocator<double>_> output_hms;
  vector<double,_std::allocator<double>_> input_hms;
  
  local_98 = jd;
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)input + 0x18))(&output_hms,input,local_90);
  CEAngle::HmsVect();
  CEAngle::~CEAngle((CEAngle *)&output_hms);
  CEDate::~CEDate(local_90);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)output + 0x18))(aCStack_a8,output,local_90);
  CEAngle::HmsVect();
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  putchar(10);
  puts("**********************************************");
  puts("* Results of ICRS -> CIRS                    *");
  puts("**********************************************");
  puts("CIRS Coordinates (output)");
  printf("    Julian Date    : %f\n",local_98);
  dVar1 = *_output_hms;
  dVar2 = _output_hms[1];
  local_98 = _output_hms[2] + _output_hms[3];
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)output + 0x18))(aCStack_a8,output,local_90);
  uVar3 = CEAngle::Deg();
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",local_98,uVar3,
         (ulong)(uint)(int)dVar1,(ulong)(uint)(int)dVar2);
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)output + 0x20))(aCStack_a8,output,local_90);
  CEAngle::Deg();
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  puts("ICRS Coordinates (input)");
  dVar1 = *_input_hms;
  dVar2 = _input_hms[1];
  local_98 = _input_hms[2] + _input_hms[3];
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)input + 0x18))(aCStack_a8,input,local_90);
  uVar3 = CEAngle::Deg();
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",local_98,uVar3,
         (ulong)(uint)(int)dVar1,(ulong)(uint)(int)dVar2);
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)input + 0x20))(aCStack_a8,input,local_90);
  CEAngle::Deg();
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  putchar(10);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&output_hms);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&input_hms);
  return;
}

Assistant:

void PrintResults(const  CESkyCoord& input,
                  const  CESkyCoord& output,
                  double jd)
{
    std::vector<double> input_hms = input.XCoord().HmsVect();
    std::vector<double> output_hms = output.XCoord().HmsVect();
    
    std::printf("\n") ;
    std::printf("**********************************************\n") ;
    std::printf("* Results of ICRS -> CIRS                    *\n") ;
    std::printf("**********************************************\n") ;
    std::printf("CIRS Coordinates (output)\n") ;
    std::printf("    Julian Date    : %f\n", jd) ;
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(output_hms[0]), int(output_hms[1]), output_hms[2]+output_hms[3],
                output.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", output.YCoord().Deg()) ;
    std::printf("ICRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(input_hms[0]), int(input_hms[1]), input_hms[2]+input_hms[3],
                input.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", input.YCoord().Deg()) ;
    std::printf("\n") ;
}